

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portioner.cpp
# Opt level: O1

vector<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
* __thiscall
Portioner::get_bucket_cluster
          (vector<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
           *__return_storage_ptr__,Portioner *this,Point_d *point_in_bucket)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  
  (__return_storage_ptr__->
  super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar2 = this->_X_Bucketsize;
  iVar4 = (int)(point_in_bucket->x - (double)((int)point_in_bucket->x % iVar2)) / iVar2;
  iVar3 = this->_Y_Bucketsize;
  iVar7 = (int)(point_in_bucket->y - (double)((int)point_in_bucket->y % iVar3)) / iVar3;
  iVar9 = iVar4 + -1;
  if (iVar4 == 0) {
    iVar9 = 0;
  }
  iVar8 = this->_width / iVar2 + -1;
  iVar2 = iVar7 + -1;
  if (iVar7 == 0) {
    iVar2 = 0;
  }
  iVar3 = this->_height / iVar3 + -1;
  if ((((iVar7 == 0) || (iVar7 == iVar3)) || (iVar4 == 0)) || (iVar4 == iVar8)) {
    if (iVar9 <= (int)(iVar4 + (uint)(iVar4 != iVar8))) {
      lVar11 = (long)iVar9;
      do {
        lVar12 = (long)iVar2 * 0x18;
        iVar9 = (uint)(iVar7 != 0) + (uint)(iVar7 != iVar3) + 1;
        if (iVar2 <= (int)(iVar7 + (uint)(iVar7 != iVar3))) {
          do {
            std::
            vector<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
            ::push_back(__return_storage_ptr__,
                        (value_type *)
                        (*(long *)&(this->_point_buckets_fast).
                                   super__Vector_base<std::vector<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>,_std::allocator<std::vector<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[lVar11].
                                   super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
                                   ._M_impl.super__Vector_impl_data + lVar12));
            lVar12 = lVar12 + 0x18;
            iVar9 = iVar9 + -1;
          } while (iVar9 != 0);
        }
        lVar11 = lVar11 + 1;
      } while (iVar4 + (uint)(iVar4 != iVar8) + 1 != (int)lVar11);
    }
  }
  else {
    lVar11 = (long)(iVar7 + -1) + -1;
    lVar12 = (long)(iVar7 + -1) * 0x18;
    lVar6 = lVar11;
    lVar10 = lVar12;
    lVar5 = (long)(iVar4 + -1);
    do {
      do {
        std::
        vector<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
        ::push_back(__return_storage_ptr__,
                    (value_type *)
                    (*(long *)&(this->_point_buckets_fast).
                               super__Vector_base<std::vector<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>,_std::allocator<std::vector<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar5].
                               super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
                               ._M_impl.super__Vector_impl_data + lVar10));
        lVar6 = lVar6 + 1;
        lVar10 = lVar10 + 0x18;
      } while (lVar6 <= iVar7);
      bVar1 = lVar5 <= iVar4;
      lVar6 = lVar11;
      lVar10 = lVar12;
      lVar5 = lVar5 + 1;
    } while (bVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<Point_d>>Portioner::get_bucket_cluster(Point_d const& point_in_bucket)
{
  std::vector<std::vector<Point_d>>point_cluster;

  long minusvalue = ((int)point_in_bucket.x%_X_Bucketsize);
  int bucket_collumn = (int)(point_in_bucket.x-minusvalue)/_X_Bucketsize;
/*
DEBUG
  std::cout<<"bucket column "<< bucket_collumn<<"\n";
  if (bucket_collumn > max_bucket_collumn){
    max_bucket_collumn = bucket_collumn;
  }
*/
  minusvalue = (int)point_in_bucket.y%_Y_Bucketsize;
  int bucket_row = (int)(point_in_bucket.y-minusvalue)/_Y_Bucketsize;

  bool  top = false;
  bool  bottom = false;
  bool  left = false;
  bool  right = false;

  int from_x, till_x, from_y, till_y;


  if(bucket_collumn == 0) {
    left = true;
    from_x = bucket_collumn;
  }
  else{
    from_x = bucket_collumn-1;
  }
  if(bucket_collumn == (_width/_X_Bucketsize-1)) {
    right = true;
    till_x = bucket_collumn;
  }
  else{
    till_x = bucket_collumn+1;
  }
  if(bucket_row == 0) {
    top = true;
    from_y = bucket_row;
  }
  else{
    from_y = bucket_row-1;
  }
  if(bucket_row == (_height/_Y_Bucketsize-1)) {
    bottom = true;
    till_y = bucket_row;

  }
  else{
    till_y = bucket_row+1;
  }
  //if point is in a bucket which is not on border of buckets
  if(top==false && bottom==false && left==false && right==false){
      for(int i = bucket_collumn-1; i<=bucket_collumn+1; i++){
        for(int j = bucket_row-1; j<= bucket_row+1; j++){
          point_cluster.push_back(_point_buckets_fast[i][j]);
        }
      }
    }

  else{ for(int i = from_x; i<=till_x; i++){
          for(int j = from_y; j<= till_y; j++){
            point_cluster.push_back(_point_buckets_fast[i][j]);
          }
        }
      }

  return point_cluster;
}